

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  uint uVar1;
  char *pcVar2;
  BaseRefVectorOf<char16_t> *this;
  undefined7 uVar9;
  ostream *poVar3;
  XMLGrammarPoolImpl *pXVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  char16_t *toTranscode;
  XSNamedMap<xercesc_4_0::XSObject> *pXVar8;
  uint uVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  bool updatedXSModel;
  ulong local_670;
  ulong local_668;
  XMLGrammarPoolImpl *local_660;
  SCMPrintHandler handler;
  ifstream fin;
  uint auStack_600 [122];
  char fURI [1000];
  
  if (argC < 2) {
    usage();
  }
  else {
    pcVar13 = (char *)0x0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    local_668 = 0;
    local_670 = 0;
    for (lVar12 = 0; (ulong)(uint)argC - 1 != lVar12; lVar12 = lVar12 + 1) {
      pcVar2 = argV[lVar12 + 1];
      if (*pcVar2 != '-') {
        if (argC + -2 == (int)lVar12) {
          pXVar4 = (XMLGrammarPoolImpl *)
                   xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)pcVar13);
          xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl
                    (pXVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          plVar5 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                      (XMLGrammarPool *)pXVar4);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgXercesSchema,1);
          (**(code **)(*plVar5 + 0x60))
                    (plVar5,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
          (**(code **)(*plVar5 + 0x60))
                    (plVar5,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,(byte)local_670 & 1);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,0);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
          (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
          (**(code **)(*plVar5 + 0x68))
                    (plVar5,&xercesc_4_0::XMLUni::fgXercesScannerName,
                     &xercesc_4_0::XMLUni::fgSGXMLScanner);
          handler.super_DefaultHandler.super_EntityResolver._vptr_EntityResolver =
               (_func_int **)&PTR__SCMPrintHandler_00107938;
          handler.super_DefaultHandler.super_DTDHandler._vptr_DTDHandler =
               (_func_int **)&PTR__SCMPrintHandler_00107a50;
          handler.super_DefaultHandler.super_ContentHandler._vptr_ContentHandler =
               (_func_int **)&PTR__SCMPrintHandler_00107a88;
          handler.super_DefaultHandler.super_ErrorHandler._vptr_ErrorHandler =
               (_func_int **)&PTR__SCMPrintHandler_00107b00;
          handler.super_DefaultHandler.super_LexicalHandler._vptr_LexicalHandler =
               (_func_int **)&PTR__SCMPrintHandler_00107b40;
          handler.super_DefaultHandler.super_DeclHandler._vptr_DeclHandler =
               (_func_int **)&PTR__SCMPrintHandler_00107b98;
          handler.fSawErrors = false;
          local_660 = pXVar4;
          (**(code **)(*plVar5 + 0x58))();
          std::ifstream::ifstream(&fin);
          if ((local_668 & 1) != 0) {
            std::ifstream::open((char *)&fin,(_Ios_Openmode)argV[lVar12 + 1]);
          }
          uVar1 = *(uint *)((long)auStack_600 + *(long *)(_fin + -0x18));
          if ((uVar1 & 5) != 0) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
            poVar3 = std::operator<<(poVar3,argV[lVar12 + 1]);
            std::endl<char,std::char_traits<char>>(poVar3);
            iVar11 = 3;
            goto LAB_00103d13;
          }
          local_670 = 0;
          uVar6 = 1;
          goto LAB_00103b02;
        }
        break;
      }
      if ((pcVar2[1] == '?') && (pcVar2[2] == '\0')) break;
      uVar9 = (undefined7)((ulong)pcVar2 >> 8);
      if (((pcVar2[1] == 'l') && (pcVar2[2] == '\0')) || ((pcVar2[1] == 'L' && (pcVar2[2] == '\0')))
         ) {
        local_668 = CONCAT71(uVar9,1);
      }
      else if (((pcVar2[1] == 'f') && (pcVar2[2] == '\0')) ||
              ((pcVar2[1] == 'F' && (pcVar2[2] == '\0')))) {
        local_670 = CONCAT71(uVar9,1);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
        poVar3 = std::operator<<(poVar3,argV[lVar12 + 1]);
        pcVar13 = "\', ignoring it\n";
        poVar3 = std::operator<<(poVar3,"\', ignoring it\n");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    usage();
  }
  return 1;
LAB_00103b02:
  if ((uVar6 & 1) != 0) {
    memset(fURI,0,1000);
    if ((local_668 & 1) == 0) {
      pcVar13 = argV[lVar12 + 1];
      goto LAB_00103b89;
    }
    if ((*(byte *)((long)auStack_600 + *(long *)(_fin + -0x18)) & 2) == 0) goto LAB_00103b37;
  }
  goto LAB_00103bbf;
LAB_00103b37:
  std::istream::getline((char *)&fin,(long)fURI);
  uVar6 = local_668;
  if (fURI[0] != '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    poVar3 = std::operator<<(poVar3,fURI);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar13 = fURI;
LAB_00103b89:
    uVar7 = (**(code **)(*plVar5 + 0x138))(plVar5,pcVar13,1,1);
    uVar6 = local_668;
    if (handler.fSawErrors == true) {
      handler.fSawErrors = false;
    }
    else {
      local_670 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
  }
  goto LAB_00103b02;
LAB_00103bbf:
  if ((local_670 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,
                    "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information"
                   );
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "********** Printing out information from Schema **********");
    std::operator<<(poVar3,"\n\n");
    lVar12 = (**(code **)(*(long *)local_660 + 0x68))(local_660,&updatedXSModel);
    if (lVar12 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No XSModel to print");
      std::operator<<(poVar3,"\n\n");
    }
    else {
      this = *(BaseRefVectorOf<char16_t> **)(lVar12 + 8);
      for (uVar10 = 0; (ulong)uVar10 < *(ulong *)(this + 0x10); uVar10 = uVar10 + 1) {
        std::operator<<((ostream *)&std::cout,"Processing Namespace:   ");
        toTranscode = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this,(ulong)uVar10);
        if ((toTranscode != (char16_t *)0x0) && (*toTranscode != L'\0')) {
          StrX::StrX((StrX *)fURI,toTranscode);
          std::operator<<((ostream *)&std::cout,(char *)CONCAT71(fURI._1_7_,fURI[0]));
          StrX::~StrX((StrX *)fURI);
        }
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "\n============================================");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        pXVar8 = (XSNamedMap<xercesc_4_0::XSObject> *)
                 xercesc_4_0::XSModel::getComponentsByNamespace
                           ((COMPONENT_TYPE)lVar12,(wchar16 *)0x2);
        processElements(pXVar8);
        pXVar8 = (XSNamedMap<xercesc_4_0::XSObject> *)
                 xercesc_4_0::XSModel::getComponentsByNamespace
                           ((COMPONENT_TYPE)lVar12,(wchar16 *)0x3);
        processTypeDefinitions(pXVar8);
      }
    }
  }
  iVar11 = 0;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00103d13:
  std::ifstream::~ifstream(&fin);
  pXVar4 = local_660;
  if ((uVar1 & 5) != 0) {
    return iVar11;
  }
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 8))();
  }
  if (pXVar4 != (XMLGrammarPoolImpl *)0x0) {
    (**(code **)(*(long *)pXVar4 + 8))(pXVar4);
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 0;
}

Assistant:

int main(int argC, char* argV[])
{
    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // cannot return out of catch-blocks lest exception-destruction
    // result in calls to destroyed memory handler!
    int errorCode = 0;
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cerr   << "Error during initialization! Message:\n"
        << StrX(toCatch.getMessage()) << std::endl;
        errorCode = 2;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    bool							doList				= false;
    bool							schemaFullChecking	= false;
    const char*                     xsdFile             = 0;
    int argInd;

    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 1;
        }
        else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
        else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    XMLGrammarPool *grammarPool = 0;
    SAX2XMLReader* parser = 0;
    try
    {
        grammarPool = new XMLGrammarPoolImpl(XMLPlatformUtils::fgMemoryManager);

        parser = XMLReaderFactory::createXMLReader(XMLPlatformUtils::fgMemoryManager, grammarPool);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
        parser->setFeature(XMLUni::fgXercesSchema, true);
        parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, false);
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
        parser->setProperty(XMLUni::fgXercesScannerName, (void *)XMLUni::fgSGXMLScanner);

        SCMPrintHandler handler;
        parser->setErrorHandler(&handler);

        bool more = true;
        bool parsedOneSchemaOkay = false;
        std::ifstream fin;

        // the input is a list file
        if (doList)
            fin.open(argV[argInd]);

        if (fin.fail()) {
            std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
            return 3;
        }

        while (more)
        {
            char fURI[1000];
            //initialize the array to zeros
            memset(fURI,0,sizeof(fURI));

            if (doList) {
                if (! fin.eof() ) {
                    fin.getline (fURI, sizeof(fURI));
                    if (!*fURI)
                        continue;
                    else {
                        xsdFile = fURI;
                        std::cerr << "==Parsing== " << xsdFile << std::endl;
                    }
                }
                else
                    break;
            }
            else {
                xsdFile = argV[argInd];
                more = false;
            }

            parser->loadGrammar(xsdFile, Grammar::SchemaGrammarType, true);
            if (handler.getSawErrors())
            {
                handler.resetErrors();
            }
            else
            {
                parsedOneSchemaOkay = true;
            }
        }

        if (parsedOneSchemaOkay)
        {
            std::cout << "********** Printing out information from Schema **********" << "\n\n";
            bool updatedXSModel;
            XSModel *xsModel = grammarPool->getXSModel(updatedXSModel);
            if (xsModel)
            {
                StringList *namespaces = xsModel->getNamespaces();
                for (unsigned i = 0; i < namespaces->size(); i++) {

                    std::cout << "Processing Namespace:   ";
                    const XMLCh *nameSpace = namespaces->elementAt(i);
                    if (nameSpace && *nameSpace)
                        std::cout << StrX(nameSpace);
                    std::cout << "\n============================================" << std::endl << std::endl;

                    processElements(xsModel->getComponentsByNamespace(XSConstants::ELEMENT_DECLARATION,
                                                                  nameSpace));
                    processTypeDefinitions(xsModel->getComponentsByNamespace(XSConstants::TYPE_DEFINITION,
                                                                         nameSpace));
                }
            }
            else
            {
                std::cout << "No XSModel to print" << "\n\n";
            }
        }
        else
        {
            std::cout << "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information";
        }

        std::cout << std::endl;
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 6;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xsdFile << "'\n"
        << "Exception message is:  \n"
        << StrX(e.getMessage()) << std::endl;
        errorCode = 4;
    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 5;
    }

    delete parser;
    delete grammarPool;
    XMLPlatformUtils::Terminate();

    return errorCode;
}